

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockNodeCalcTabBarLayout
               (ImGuiDockNode *node,ImRect *out_title_rect,ImRect *out_tab_bar_rect,
               ImVec2 *out_window_menu_button_pos)

{
  float fVar1;
  int iVar2;
  ImGuiContext *pIVar3;
  ImVec2 IVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  pIVar3 = GImGui;
  IVar4 = node->Pos;
  fVar7 = IVar4.x;
  fVar5 = IVar4.y;
  fVar6 = (node->Size).x + fVar7;
  fVar8 = (GImGui->Style).FramePadding.y;
  fVar8 = fVar8 + fVar8 + GImGui->FontSize + fVar5;
  if (out_title_rect != (ImRect *)0x0) {
    out_title_rect->Min = IVar4;
    (out_title_rect->Max).x = fVar6;
    (out_title_rect->Max).y = fVar8;
  }
  fVar1 = (pIVar3->Style).FramePadding.x;
  fVar6 = fVar6 - fVar1;
  if ((*(uint *)&node->field_0xb8 >> 0xb & 1) != 0) {
    fVar6 = fVar6 - pIVar3->FontSize;
  }
  fVar9 = fVar7 + fVar1;
  if ((*(uint *)&node->field_0xb8 >> 0xc & 1) != 0) {
    iVar2 = (pIVar3->Style).WindowMenuButtonPosition;
    if (iVar2 == 1) {
      fVar7 = fVar6 - (fVar1 + pIVar3->FontSize);
      fVar6 = fVar7;
    }
    else if (iVar2 == 0) {
      fVar9 = fVar9 + pIVar3->FontSize;
    }
  }
  if (out_tab_bar_rect != (ImRect *)0x0) {
    (out_tab_bar_rect->Min).x = fVar9;
    (out_tab_bar_rect->Min).y = fVar5;
    (out_tab_bar_rect->Max).x = fVar6;
    (out_tab_bar_rect->Max).y = fVar8;
  }
  if (out_window_menu_button_pos != (ImVec2 *)0x0) {
    IVar4.y = fVar5;
    IVar4.x = fVar7;
    *out_window_menu_button_pos = IVar4;
  }
  return;
}

Assistant:

static void ImGui::DockNodeCalcTabBarLayout(const ImGuiDockNode* node, ImRect* out_title_rect, ImRect* out_tab_bar_rect, ImVec2* out_window_menu_button_pos)
{
    ImGuiContext& g = *GImGui;
    ImRect r = ImRect(node->Pos.x, node->Pos.y, node->Pos.x + node->Size.x, node->Pos.y + g.FontSize + g.Style.FramePadding.y * 2.0f);
    if (out_title_rect) { *out_title_rect = r; }

    ImVec2 window_menu_button_pos = r.Min;
    r.Min.x += g.Style.FramePadding.x;
    r.Max.x -= g.Style.FramePadding.x;
    if (node->HasCloseButton)
    {
        r.Max.x -= g.FontSize;// +1.0f; // In DockNodeUpdateTabBar() we currently display a disabled close button even if there is none.
    }
    if (node->HasWindowMenuButton && g.Style.WindowMenuButtonPosition == ImGuiDir_Left)
    {
        r.Min.x += g.FontSize; // + g.Style.ItemInnerSpacing.x; // <-- Adding ItemInnerSpacing makes the title text moves slightly when in a docking tab bar. Instead we adjusted RenderArrowDockMenu()
    }
    else if (node->HasWindowMenuButton && g.Style.WindowMenuButtonPosition == ImGuiDir_Right)
    {
        r.Max.x -= g.FontSize + g.Style.FramePadding.x;
        window_menu_button_pos = ImVec2(r.Max.x, r.Min.y);
    }
    if (out_tab_bar_rect) { *out_tab_bar_rect = r; }
    if (out_window_menu_button_pos) { *out_window_menu_button_pos = window_menu_button_pos; }
}